

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O2

void deallocAntecedentConsequentVectorsStruct(antecedentConsequentVectorsStruct *toBeDeleted)

{
  if (toBeDeleted != (antecedentConsequentVectorsStruct *)0x0) {
    if (toBeDeleted->attrAntecedents != (Vec_Int_t *)0x0) {
      Vec_IntFree(toBeDeleted->attrAntecedents);
    }
    if (toBeDeleted->attrConsequentCandidates != (Vec_Int_t *)0x0) {
      Vec_IntFree(toBeDeleted->attrConsequentCandidates);
    }
    free(toBeDeleted);
    return;
  }
  __assert_fail("toBeDeleted != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/disjunctiveMonotone.c"
                ,0x40,
                "void deallocAntecedentConsequentVectorsStruct(struct antecedentConsequentVectorsStruct *)"
               );
}

Assistant:

void deallocAntecedentConsequentVectorsStruct(struct antecedentConsequentVectorsStruct *toBeDeleted)
{
	assert( toBeDeleted != NULL );
	if(toBeDeleted->attrAntecedents) 
		Vec_IntFree( toBeDeleted->attrAntecedents );
	if(toBeDeleted->attrConsequentCandidates)
		Vec_IntFree( toBeDeleted->attrConsequentCandidates );
	free( toBeDeleted );
}